

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drbg_hmac.c
# Opt level: O0

OSSL_PARAM * drbg_hmac_gettable_ctx_params(void *vctx,void *p_ctx)

{
  void *p_ctx_local;
  void *vctx_local;
  
  return drbg_hmac_gettable_ctx_params::known_gettable_ctx_params;
}

Assistant:

static const OSSL_PARAM *drbg_hmac_gettable_ctx_params(ossl_unused void *vctx,
                                                       ossl_unused void *p_ctx)
{
    static const OSSL_PARAM known_gettable_ctx_params[] = {
        OSSL_PARAM_utf8_string(OSSL_DRBG_PARAM_MAC, NULL, 0),
        OSSL_PARAM_utf8_string(OSSL_DRBG_PARAM_DIGEST, NULL, 0),
        OSSL_PARAM_DRBG_GETTABLE_CTX_COMMON,
        OSSL_PARAM_END
    };
    return known_gettable_ctx_params;
}